

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<float> * __thiscall
Fad<float>::operator+=
          (Fad<float> *this,
          FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_> *x)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *pFVar8;
  Fad<float> *pFVar9;
  Fad<float> *pFVar10;
  Fad<float> *pFVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  value_type vVar19;
  
  pFVar8 = (x->fadexpr_).left_;
  pFVar9 = (x->fadexpr_).right_;
  pFVar10 = (pFVar8->fadexpr_).left_;
  pFVar11 = (pFVar8->fadexpr_).right_;
  uVar4 = (pFVar10->dx_).num_elts;
  uVar5 = (pFVar11->dx_).num_elts;
  uVar18 = uVar5;
  if ((int)uVar5 < (int)uVar4) {
    uVar18 = uVar4;
  }
  uVar6 = (pFVar9->dx_).num_elts;
  if ((int)uVar18 <= (int)uVar6) {
    uVar18 = uVar6;
  }
  if (uVar18 != 0) {
    uVar7 = (this->dx_).num_elts;
    uVar17 = (ulong)uVar7;
    if (uVar17 == 0) {
      (this->dx_).num_elts = uVar18;
      uVar16 = (ulong)uVar18;
      uVar17 = 0xffffffffffffffff;
      if (-1 < (int)uVar18) {
        uVar17 = uVar16 * 4;
      }
      pfVar15 = (float *)operator_new__(uVar17);
      (this->dx_).ptr_to_data = pfVar15;
      if ((((pFVar10->dx_).num_elts == 0) || ((pFVar11->dx_).num_elts == 0)) ||
         ((pFVar9->dx_).num_elts == 0)) {
        if (0 < (int)uVar18) {
          uVar17 = 0;
          do {
            vVar19 = FadBinaryDiv<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>::dx
                               (&x->fadexpr_,(int)uVar17);
            pfVar15[uVar17] = vVar19;
            uVar17 = uVar17 + 1;
          } while (uVar16 != uVar17);
        }
      }
      else if (0 < (int)uVar18) {
        pfVar12 = (pFVar10->dx_).ptr_to_data;
        pfVar13 = (pFVar11->dx_).ptr_to_data;
        pfVar14 = (pFVar9->dx_).ptr_to_data;
        fVar1 = pFVar11->val_;
        fVar2 = pFVar10->val_;
        fVar3 = pFVar9->val_;
        uVar17 = 0;
        do {
          pfVar15[uVar17] =
               ((pfVar12[uVar17] * fVar1 + pfVar13[uVar17] * fVar2) * fVar3 -
               pfVar14[uVar17] * fVar1 * fVar2) / (fVar3 * fVar3);
          uVar17 = uVar17 + 1;
        } while (uVar16 != uVar17);
      }
    }
    else {
      pfVar15 = (this->dx_).ptr_to_data;
      if ((uVar5 == 0 || uVar4 == 0) || uVar6 == 0) {
        if (0 < (int)uVar7) {
          uVar16 = 0;
          do {
            vVar19 = FadBinaryDiv<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>::dx
                               (&x->fadexpr_,(int)uVar16);
            pfVar15[uVar16] = vVar19 + pfVar15[uVar16];
            uVar16 = uVar16 + 1;
          } while (uVar17 != uVar16);
        }
      }
      else if (0 < (int)uVar7) {
        pfVar12 = (pFVar10->dx_).ptr_to_data;
        pfVar13 = (pFVar11->dx_).ptr_to_data;
        pfVar14 = (pFVar9->dx_).ptr_to_data;
        uVar16 = 0;
        do {
          fVar1 = pFVar9->val_;
          pfVar15[uVar16] =
               ((pfVar12[uVar16] * pFVar11->val_ + pfVar13[uVar16] * pFVar10->val_) * fVar1 -
               pFVar11->val_ * pFVar10->val_ * pfVar14[uVar16]) / (fVar1 * fVar1) + pfVar15[uVar16];
          uVar16 = uVar16 + 1;
        } while (uVar17 != uVar16);
      }
    }
  }
  pFVar8 = (x->fadexpr_).left_;
  this->val_ = (((pFVar8->fadexpr_).left_)->val_ * ((pFVar8->fadexpr_).right_)->val_) /
               ((x->fadexpr_).right_)->val_ + this->val_;
  return this;
}

Assistant:

inline  Fad<T> & Fad<T>::operator+= (const FadExpr<ExprT>& x)
{
  int xsz = x.size(), sz = dx_.size();

  if (xsz) {
    if (sz) {
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for (int i=0; i<sz; ++i)
	  dxp[i] += x.fastAccessDx(i);
      else
	for (int i=0; i<sz; ++i)
	  dxp[i] += x.dx(i);
    }
    else {
      dx_.resize(xsz);
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for (int i=0; i<xsz; ++i)
	  dxp[i] = x.fastAccessDx(i);
      else
	for (int i=0; i<xsz; ++i)
	  dxp[i] = x.dx(i);
    }
  }

  val_ += x.val();

  return *this;
}